

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O2

void testSharedFrameBuffer(string *tempDir)

{
  Rgba *pRVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  RgbaChannels in_R8D;
  Compression in_R9D;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  long local_98;
  Array2D<Imf_3_4::Rgba> p1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Testing reading from and writing to files using\nmultiple threads and a shared framebuffer"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar2 = IlmThread_3_4::supportsThreads();
  if (cVar2 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"   Threading not supported!");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    p1._sizeX = 0x9f;
    p1._sizeY = 0x55b;
    p1._data = (Rgba *)operator_new__(0x1a9c28);
    local_98 = 0;
    iVar6 = 0;
    uVar7 = 0;
    local_58 = tempDir;
    while( true ) {
      __lhs = local_58;
      if (uVar7 == 0x9f) break;
      iVar5 = iVar6 + (int)((uVar7 & 0xffffffff) / 100) * -10000;
      local_40 = (double)(int)uVar7 * 0.2;
      local_48 = (double)(int)uVar7 * 0.3;
      lVar4 = 6;
      uVar8 = 0;
      local_50 = uVar7;
      while( true ) {
        pRVar1 = p1._data;
        lVar10 = p1._sizeY;
        if (uVar8 == 0x55b) break;
        dVar11 = Imath_3_2::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        lVar10 = lVar10 * local_98;
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar1 + lVar4 + lVar10 + -6),
                   (float)(dVar11 + (double)(iVar5 + (int)((uVar8 & 0xffffffff) / 100) * -100)));
        local_38 = sin((double)(int)uVar8 * 0.1 + local_40);
        dVar11 = Imath_3_2::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar1 + lVar4 + lVar10 + -4),
                   (float)(local_38 * 0.5 + 0.5 + dVar11));
        dVar11 = sin((double)(int)uVar8 * 0.1 + local_48);
        dVar12 = Imath_3_2::Rand48::nextf
                           ((Rand48 *)&(anonymous_namespace)::rand1,-0.009999999776482582,
                            -0.009999999776482582);
        Imath_3_2::half::operator=
                  ((half *)((long)pRVar1 + lVar4 + lVar10 + -2),(float)(dVar11 * 0.5 + 0.5 + dVar12)
                  );
        dVar11 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
        Imath_3_2::half::operator=
                  ((half *)((long)&(pRVar1->r)._h + lVar10 + lVar4),
                   (float)((1.0 - dVar11) * 0.0 + dVar11));
        uVar8 = uVar8 + 1;
        iVar5 = iVar5 + 1;
        lVar4 = lVar4 + 8;
      }
      uVar7 = local_50 + 1;
      iVar6 = iVar6 + 100;
      local_98 = local_98 + 8;
    }
    for (iVar6 = 0; iVar6 != 9; iVar6 = iVar6 + 1) {
      Imf_3_4::setGlobalThreadCount(iVar6 * 3 & 7);
      poVar3 = std::operator<<((ostream *)&std::cout,"number of threads: ");
      iVar5 = Imf_3_4::globalThreadCount();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      for (uVar9 = 0; uVar9 != 10; uVar9 = uVar9 + 1) {
        std::operator+(&local_78,__lhs,"imf_test_rgba.exr");
        iVar5 = (int)&p1;
        anon_unknown.dwarf_2869d8::writeReadRGBA
                  (local_78._M_dataplus._M_p,iVar5,0xf,(Array2D<Imf_3_4::Rgba> *)(ulong)uVar9,in_R8D
                   ,in_R9D);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,__lhs,"imf_test_rgba.exr");
        anon_unknown.dwarf_2869d8::writeReadRGBA
                  (local_78._M_dataplus._M_p,iVar5,7,(Array2D<Imf_3_4::Rgba> *)(ulong)uVar9,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,__lhs,"imf_test_rgba.exr");
        anon_unknown.dwarf_2869d8::writeReadRGBA
                  (local_78._M_dataplus._M_p,iVar5,8,(Array2D<Imf_3_4::Rgba> *)(ulong)uVar9,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,__lhs,"imf_test_rgba.exr");
        anon_unknown.dwarf_2869d8::writeReadRGBA
                  (local_78._M_dataplus._M_p,iVar5,5,(Array2D<Imf_3_4::Rgba> *)(ulong)uVar9,in_R8D,
                   in_R9D);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
    std::endl<char,std::char_traits<char>>(poVar3);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
  }
  return;
}

Assistant:

void
testSharedFrameBuffer (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading from and writing to files using\n"
                "multiple threads and a shared framebuffer"
             << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }

#if ILMTHREAD_THREADING_ENABLED
        const int W = 1371;
        const int H = 159;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGBA,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_RGB,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    WRITE_A,
                    Compression (comp));

                writeReadRGBA (
                    (tempDir + "imf_test_rgba.exr").c_str (),
                    W,
                    H,
                    p1,
                    RgbaChannels (WRITE_R | WRITE_B),
                    Compression (comp));
            }
        }
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}